

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# host.cpp
# Opt level: O0

StartResult __thiscall
chatter::Host::start(Host *this,HostAddress *bind_address,uint16_t max_connections)

{
  uint16_t uVar1;
  bool bVar2;
  ostream *poVar3;
  size_type sVar4;
  thread *ptVar5;
  Host *local_4d8;
  code *local_4d0;
  undefined8 local_4c8;
  Host *local_4c0;
  code *local_4b8;
  undefined8 local_4b0;
  rep local_4a8;
  undefined1 local_490 [8];
  Peer p;
  int peer_id;
  uint16_t max_connections_local;
  HostAddress *bind_address_local;
  Host *this_local;
  
  if ((this->m_run_threads & 1U) == 0) {
    p.m_channels[0x20].sent_reliable.
    super__List_base<std::shared_ptr<chatter::Packet>,_std::allocator<std::shared_ptr<chatter::Packet>_>_>
    ._M_impl._M_node._M_size._6_2_ = max_connections;
    bVar2 = create_socket(this);
    if (bVar2) {
      bVar2 = platform::SocketBind(this->m_socket,bind_address);
      if (bVar2) {
        uVar1 = p.m_channels[0x20].sent_reliable.
                super__List_base<std::shared_ptr<chatter::Packet>,_std::allocator<std::shared_ptr<chatter::Packet>_>_>
                ._M_impl._M_node._M_size._6_2_;
        if (p.m_channels[0x20].sent_reliable.
            super__List_base<std::shared_ptr<chatter::Packet>,_std::allocator<std::shared_ptr<chatter::Packet>_>_>
            ._M_impl._M_node._M_size._6_2_ == 0) {
          uVar1 = 1;
        }
        this->m_max_connections = uVar1;
        std::vector<chatter::Peer,_std::allocator<chatter::Peer>_>::clear(&this->m_peers);
        std::vector<chatter::Peer,_std::allocator<chatter::Peer>_>::reserve
                  (&this->m_peers,(ulong)this->m_max_connections);
        for (p.m_channels[0x20].sent_reliable.
             super__List_base<std::shared_ptr<chatter::Packet>,_std::allocator<std::shared_ptr<chatter::Packet>_>_>
             ._M_impl._M_node._M_size._0_4_ = 0;
            (int)(PeerID)p.m_channels[0x20].sent_reliable.
                         super__List_base<std::shared_ptr<chatter::Packet>,_std::allocator<std::shared_ptr<chatter::Packet>_>_>
                         ._M_impl._M_node._M_size < (int)(uint)this->m_max_connections;
            p.m_channels[0x20].sent_reliable.
            super__List_base<std::shared_ptr<chatter::Packet>,_std::allocator<std::shared_ptr<chatter::Packet>_>_>
            ._M_impl._M_node._M_size._0_4_ =
                 (PeerID)p.m_channels[0x20].sent_reliable.
                         super__List_base<std::shared_ptr<chatter::Packet>,_std::allocator<std::shared_ptr<chatter::Packet>_>_>
                         ._M_impl._M_node._M_size + 1) {
          Peer::Peer((Peer *)local_490);
          local_490._4_4_ =
               (PeerID)p.m_channels[0x20].sent_reliable.
                       super__List_base<std::shared_ptr<chatter::Packet>,_std::allocator<std::shared_ptr<chatter::Packet>_>_>
                       ._M_impl._M_node._M_size;
          std::vector<chatter::Peer,_std::allocator<chatter::Peer>_>::push_back
                    (&this->m_peers,(Peer *)local_490);
          Peer::~Peer((Peer *)local_490);
        }
        poVar3 = std::operator<<((ostream *)&std::cout,"m_peers allocated: size:");
        sVar4 = std::vector<chatter::Peer,_std::allocator<chatter::Peer>_>::size(&this->m_peers);
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,sVar4);
        poVar3 = std::operator<<(poVar3," cap:");
        sVar4 = std::vector<chatter::Peer,_std::allocator<chatter::Peer>_>::capacity(&this->m_peers)
        ;
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,sVar4);
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        local_4a8 = std::chrono::_V2::system_clock::now();
        (this->m_start_time).__d.__r = local_4a8;
        this->m_run_threads = true;
        ptVar5 = (thread *)operator_new(8);
        local_4b8 = net_worker;
        local_4b0 = 0;
        local_4c0 = this;
        std::thread::thread<void(chatter::Host::*)(),chatter::Host*,void>
                  (ptVar5,(type *)&local_4b8,&local_4c0);
        std::unique_ptr<std::thread,_std::default_delete<std::thread>_>::reset
                  (&this->m_net_worker,ptVar5);
        std::unique_ptr<std::thread,_std::default_delete<std::thread>_>::operator->
                  (&this->m_net_worker);
        std::thread::detach();
        ptVar5 = (thread *)operator_new(8);
        local_4d0 = recv_worker;
        local_4c8 = 0;
        local_4d8 = this;
        std::thread::thread<void(chatter::Host::*)(),chatter::Host*,void>
                  (ptVar5,(type *)&local_4d0,&local_4d8);
        std::unique_ptr<std::thread,_std::default_delete<std::thread>_>::reset
                  (&this->m_recv_worker,ptVar5);
        std::unique_ptr<std::thread,_std::default_delete<std::thread>_>::operator->
                  (&this->m_recv_worker);
        std::thread::detach();
        this_local._4_4_ = START_OK;
      }
      else {
        this_local._4_4_ = SOCKET_BIND_FAILED;
      }
    }
    else {
      this_local._4_4_ = SOCKET_CREATE_FAILED;
    }
  }
  else {
    this_local._4_4_ = ALREADY_RUNNING;
  }
  return this_local._4_4_;
}

Assistant:

Host::StartResult Host::start(const HostAddress& bind_address, uint16_t max_connections)
{
    if (m_run_threads)
        return ALREADY_RUNNING;

    if (!create_socket())
        return SOCKET_CREATE_FAILED;

    if (!platform::SocketBind(m_socket, bind_address))
        return SOCKET_BIND_FAILED;

    m_max_connections = max_connections > 0 ? max_connections : 1;

    m_peers.clear();
    m_peers.reserve(m_max_connections);
    for (int peer_id = 0; peer_id < m_max_connections; ++peer_id) {
        Peer p;
        p.m_id = peer_id;
        m_peers.push_back(p);
    }

    std::cout << "m_peers allocated: size:" << m_peers.size() << " cap:" << m_peers.capacity() << std::endl;

    m_start_time = std::chrono::high_resolution_clock::now();

    m_run_threads = true;
    m_net_worker.reset(new std::thread(&Host::net_worker, this));
    m_net_worker->detach();
    m_recv_worker.reset(new std::thread(&Host::recv_worker, this));
    m_recv_worker->detach();

    return START_OK;
}